

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O2

void __thiscall
MultiANN::NearestNeighbor
          (MultiANN *this,ANNpoint *x,ANNpoint *best_dist,int **best_idx,void ***best_ptr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ANNpoint pAVar8;
  int *piVar9;
  ANNpoint pAVar10;
  int iVar11;
  int *piVar12;
  void *pvVar13;
  double *pdVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double *d1;
  int *node_list;
  long local_78;
  void ***local_70;
  double local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  uVar19 = (ulong)this->NumNeighbors;
  uVar24 = uVar19 * 4;
  if ((long)uVar19 < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  uVar23 = uVar19 * 8;
  if ((long)uVar19 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  local_70 = best_ptr;
  piVar12 = (int *)operator_new__(uVar24);
  node_list = piVar12;
  pvVar13 = operator_new__(uVar24);
  pdVar14 = (double *)operator_new__(uVar23);
  d1 = pdVar14;
  pvVar15 = operator_new__(uVar23);
  pAVar8 = *best_dist;
  piVar9 = *best_idx;
  for (lVar17 = 0; lVar17 < (int)uVar19; lVar17 = lVar17 + 1) {
    pAVar8[lVar17] = INFINITY;
    pdVar14[lVar17] = 0.0;
    *(undefined8 *)((long)pvVar15 + lVar17 * 8) = 0;
    piVar9[lVar17] = 0;
    piVar12[lVar17] = 0;
    *(undefined4 *)((long)pvVar13 + lVar17 * 4) = 0;
    uVar19 = (ulong)(uint)this->NumNeighbors;
  }
  iVar11 = 0;
  for (uVar24 = 0x1e; 3 < uVar24; uVar24 = uVar24 - 1) {
    if (this->AnnArray[uVar24] != (ANN *)0x0) {
      ANN::NearestNeighbor
                (this->AnnArray[uVar24],this->topology,this->scaling,x,this->NumNeighbors,&d1,
                 &node_list);
      iVar11 = this->NumNeighbors;
      pAVar8 = *best_dist;
      piVar9 = *best_idx;
      iVar21 = 0;
      iVar22 = 0;
      for (lVar17 = 0; ((iVar21 < iVar11 && (iVar22 < iVar11)) && (lVar17 < iVar11));
          lVar17 = lVar17 + 1) {
        dVar27 = pAVar8[iVar21];
        lVar18 = (long)iVar22;
        if (dVar27 <= d1[lVar18]) {
          piVar12 = piVar9 + iVar21;
          iVar21 = iVar21 + 1;
        }
        else {
          piVar12 = node_list + iVar22;
          iVar22 = iVar22 + 1;
          dVar27 = d1[lVar18];
        }
        iVar7 = *piVar12;
        *(double *)((long)pvVar15 + lVar17 * 8) = dVar27;
        *(int *)((long)pvVar13 + lVar17 * 4) = iVar7;
      }
      for (lVar17 = 0; lVar17 < iVar11; lVar17 = lVar17 + 1) {
        pAVar8[lVar17] = *(ANNcoord *)((long)pvVar15 + lVar17 * 8);
        piVar9[lVar17] = *(int *)((long)pvVar13 + lVar17 * 4);
        iVar11 = this->NumNeighbors;
      }
      iVar11 = ANN::LastNode(this->AnnArray[uVar24]);
      iVar11 = (uint)(iVar11 != this->size) + iVar11;
    }
  }
  lVar17 = (long)iVar11;
  while (this->size != (int)lVar17) {
    pAVar8 = this->points_coor[lVar17];
    dVar27 = 0.0;
    iVar11 = 0;
    local_78 = lVar17;
    while (iVar11 < this->dimension) {
      iVar21 = this->topology[iVar11];
      if (iVar21 == 3) {
        dVar25 = pAVar8[iVar11];
        pAVar10 = *x;
        dVar26 = pAVar10[iVar11];
        dVar1 = pAVar8[(long)iVar11 + 1];
        dVar2 = pAVar8[(long)iVar11 + 2];
        dVar3 = pAVar10[(long)iVar11 + 1];
        dVar4 = pAVar10[(long)iVar11 + 2];
        dVar5 = pAVar8[(long)iVar11 + 3];
        dVar6 = pAVar10[(long)iVar11 + 3];
        local_58 = dVar5 * dVar6 + dVar2 * dVar4 + dVar25 * dVar26 + dVar1 * dVar3;
        if (1.0 < local_58) {
          local_58 = local_58 /
                     ((dVar6 * dVar6 + dVar4 * dVar4 + dVar26 * dVar26 + dVar3 * dVar3) *
                     (dVar5 * dVar5 + dVar2 * dVar2 + dVar25 * dVar25 + dVar1 * dVar1));
        }
        uStack_50 = 0;
        iVar22 = iVar11 + 3;
        local_60 = dVar27;
        local_68 = acos(local_58);
        local_48 = -local_58;
        uStack_40 = uStack_50 ^ 0x8000000000000000;
        dVar27 = acos(local_48);
        dVar27 = acos((double)(~-(ulong)(dVar27 < local_68) & (ulong)local_58 |
                              (ulong)local_48 & -(ulong)(dVar27 < local_68)));
        dVar27 = dVar27 * this->scaling[iVar11];
        dVar27 = local_60 + dVar27 * dVar27;
      }
      else {
        iVar22 = iVar11;
        if (iVar21 == 2) {
          dVar26 = ABS(pAVar8[iVar11] - (*x)[iVar11]);
          dVar25 = 6.283185307179586 - dVar26;
          if (dVar26 <= 6.283185307179586 - dVar26) {
            dVar25 = dVar26;
          }
          dVar25 = dVar25 * this->scaling[iVar11];
          dVar27 = dVar27 + dVar25 * dVar25;
        }
        else if (iVar21 == 1) {
          dVar25 = (pAVar8[iVar11] - (*x)[iVar11]) * this->scaling[iVar11];
          dVar27 = dVar27 + dVar25 * dVar25;
        }
      }
      iVar11 = iVar22 + 1;
    }
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
    }
    else {
      dVar27 = SQRT(dVar27);
    }
    iVar11 = this->NumNeighbors;
    iVar21 = iVar11 + 2;
    pAVar8 = *best_dist;
    bVar20 = true;
    for (lVar17 = 0; (bVar20 && (lVar17 < iVar11)); lVar17 = lVar17 + 1) {
      bVar20 = pAVar8[lVar17] <= dVar27;
      if (dVar27 < pAVar8[lVar17]) {
        iVar21 = (int)lVar17;
      }
    }
    if (iVar21 < iVar11) {
      piVar9 = *best_idx;
      lVar18 = (long)iVar21;
      lVar17 = (long)iVar11;
      while (lVar16 = lVar17 + -1, lVar18 < lVar16) {
        pAVar8[lVar16] = pAVar8[lVar17 + -2];
        piVar9[lVar16] = piVar9[lVar17 + -2];
        lVar17 = lVar16;
      }
      (*best_idx)[lVar18] = (int)local_78;
      (*best_dist)[lVar18] = dVar27;
    }
    lVar17 = local_78 + 1;
  }
  uVar19 = 0;
  uVar24 = (ulong)(uint)this->NumNeighbors;
  if (this->NumNeighbors < 1) {
    uVar24 = uVar19;
  }
  for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    (*local_70)[uVar19] = this->points_ptr[(*best_idx)[uVar19]];
  }
  if (node_list != (int *)0x0) {
    operator_delete__(node_list);
  }
  operator_delete__(pvVar13);
  operator_delete__(pvVar15);
  if (d1 != (double *)0x0) {
    operator_delete__(d1);
  }
  return;
}

Assistant:

void MultiANN::NearestNeighbor(
    const ANNpoint &x,  // query point
    ANNpoint &
        best_dist,     // distances from the  nearest neighbors to x (returned)
    int *&best_idx,    // indices of the nearest neighbors to x (returned)
    void **&best_ptr)  // pointers to the nearest neighbors to x (returned)
{
    int n, n_last, j, k, l, m;
    double d;

    int *node_list = new int[NumNeighbors];
    int *help_list = new int[NumNeighbors];
    double *d1 = new double[NumNeighbors];
    double *d_help = new double[NumNeighbors];

    for (int i = 0; i < NumNeighbors; i++) {
        best_dist[i] = INFINITY;
        d1[i] = 0.0;
        d_help[i] = 0.0;
        best_idx[i] = 0;
        node_list[i] = 0;
        help_list[i] = 0;
    }

    n_last = n = 0;  // Keeps the warnings away

    // Find the nearest neighbor
    // First check the ANN trees
    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
        if (AnnArray[k]) {
            AnnArray[k]->NearestNeighbor(topology, scaling, x, NumNeighbors, d1,
                                         node_list);
            m = 0;
            j = 0;
            l = 0;
            while (m < NumNeighbors && j < NumNeighbors && l < NumNeighbors) {
                if (best_dist[m] > d1[j]) {
                    d_help[l] = d1[j];
                    help_list[l] = node_list[j];
                    j++;
                    l++;
                } else {
                    d_help[l] = best_dist[m];
                    help_list[l] = best_idx[m];
                    m++;
                    l++;
                }
            }
            for (int i = 0; i < NumNeighbors; i++) {
                best_dist[i] = d_help[i];
                best_idx[i] = help_list[i];
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    // Check the new nodes, which are not yet in the ANN tree
    for (n = n_last; n != size; n++) {
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        bool flag = true;
        int ind = NumNeighbors + 2;
        j = 0;
        while (flag && j < NumNeighbors) {
            if (d < best_dist[j]) {
                flag = false;
                ind = j;
            }
            j++;
        }
        if (ind < NumNeighbors) {
            for (int m = (NumNeighbors - 1); m > ind; m--) {
                best_dist[m] = best_dist[m - 1];
                best_idx[m] = best_idx[m - 1];
            }
            best_idx[ind] = n;
            best_dist[ind] = d;
        }
    }

    for (int i = 0; i < NumNeighbors; i++) {
        best_ptr[i] = points_ptr[best_idx[i]];
    }

    delete[] node_list;
    delete[] help_list;
    delete[] d_help;
    delete[] d1;
}